

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STTx.cpp
# Opt level: O0

Item * jbcoin::getTxFormat(TxType type)

{
  KnownFormats<jbcoin::TxType> *this;
  string local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  Item *local_18;
  Item *format;
  TxType type_local;
  
  format._4_4_ = type;
  this = &TxFormats::getInstance()->super_KnownFormats<jbcoin::TxType>;
  local_18 = KnownFormats<jbcoin::TxType>::findByType(this,format._4_4_);
  if (local_18 == (Item *)0x0) {
    std::__cxx11::to_string(&local_58,format._4_4_);
    std::operator+(&local_38,"Invalid transaction type ",&local_58);
    Throw<std::runtime_error,std::__cxx11::string>(&local_38);
  }
  return local_18;
}

Assistant:

static
auto getTxFormat (TxType type)
{
    auto format = TxFormats::getInstance().findByType (type);

    if (format == nullptr)
    {
        Throw<std::runtime_error> (
            "Invalid transaction type " +
            std::to_string (
                static_cast<std::underlying_type_t<TxType>>(type)));
    }

    return format;
}